

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_arg.cxx
# Opt level: O1

int Fl::args(int argc,char **argv,int *i,Fl_Args_Handler cb)

{
  int iVar1;
  
  arg_called = 1;
  *i = 1;
  iVar1 = 1;
  if (1 < argc) {
    do {
      if (((cb == (Fl_Args_Handler)0x0) || (iVar1 = (*cb)(argc,argv,i), iVar1 == 0)) &&
         (iVar1 = arg(argc,argv,i), iVar1 == 0)) {
        if (return_i == '\0') {
          return 0;
        }
        return *i;
      }
      iVar1 = *i;
    } while (iVar1 < argc);
  }
  return iVar1;
}

Assistant:

int Fl::args(int argc, char** argv, int& i, Fl_Args_Handler cb) {
  arg_called = 1;
  i = 1; // skip argv[0]
  while (i < argc) {
    if (cb && cb(argc,argv,i)) continue;
    if (!arg(argc,argv,i)) return return_i ? i : 0;
  }
  return i;
}